

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool __thiscall
cmComputeLinkInformation::CheckSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string soname;
  string file;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::GetFilenameName(&local_38,item);
  bVar2 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,local_38._M_dataplus._M_p);
  if (bVar2) {
    paVar1 = &local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = cmSystemTools::GuessLibrarySOName(item,&local_58);
    if (!bVar2) {
      AddSharedLibNoSOName(this,item);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      bVar2 = true;
      goto LAB_003a32ec;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar2 = false;
LAB_003a32ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmComputeLinkInformation::CheckSharedLibNoSOName(std::string const& item)
{
  // This platform will use the path to a library as its soname if the
  // library is given via path and was not built with an soname.  If
  // this is a shared library that might be the case.
  std::string file = cmSystemTools::GetFilenameName(item);
  if(this->ExtractSharedLibraryName.find(file))
    {
    // If we can guess the soname fairly reliably then assume the
    // library has one.  Otherwise assume the library has no builtin
    // soname.
    std::string soname;
    if(!cmSystemTools::GuessLibrarySOName(item, soname))
      {
      this->AddSharedLibNoSOName(item);
      return true;
      }
    }
  return false;
}